

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O2

void active_print_result(int f,float res,float weight,v_array<char> tag)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  void *local_1e8;
  ulong local_1e0;
  char temp [30];
  stringstream ss;
  ostream local_190;
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    sprintf(temp,"%f",SUB84((double)res,0));
    std::operator<<(&local_190,temp);
    iVar1 = print_tag(&ss,tag);
    if (iVar1 == 0) {
      std::operator<<(&local_190,' ');
    }
    if (0.0 <= weight) {
      sprintf(temp," %f",SUB84((double)weight,0));
      std::operator<<(&local_190,temp);
    }
    std::operator<<(&local_190,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringbuf::str();
    uVar2 = io_buf::write_file_or_socket(f,local_1e8,local_1e0 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (uVar2 != local_1e0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void active_print_result(int f, float res, float weight, v_array<char> tag)
{
  if (f >= 0)
  {
    std::stringstream ss;
    char temp[30];
    sprintf(temp, "%f", res);
    ss << temp;
    if (!print_tag(ss, tag))
      ss << ' ';
    if (weight >= 0)
    {
      sprintf(temp, " %f", weight);
      ss << temp;
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}